

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBMirrorRow_C(uint8_t *src,uint8_t *dst,int width)

{
  uint32_t *dst32;
  uint32_t *src32;
  int x;
  int width_local;
  uint8_t *dst_local;
  uint8_t *src_local;
  
  src32 = (uint32_t *)(src + (long)(width + -1) * 4);
  for (x = 0; x < width + -1; x = x + 2) {
    *(uint32_t *)(dst + (long)x * 4) = *src32;
    *(uint32_t *)(dst + (long)(x + 1) * 4) = src32[-1];
    src32 = src32 + -2;
  }
  if ((width & 1U) != 0) {
    *(uint32_t *)(dst + (long)(width + -1) * 4) = *src32;
  }
  return;
}

Assistant:

void ARGBMirrorRow_C(const uint8_t* src, uint8_t* dst, int width) {
  int x;
  const uint32_t* src32 = (const uint32_t*)(src);
  uint32_t* dst32 = (uint32_t*)(dst);
  src32 += width - 1;
  for (x = 0; x < width - 1; x += 2) {
    dst32[x] = src32[0];
    dst32[x + 1] = src32[-1];
    src32 -= 2;
  }
  if (width & 1) {
    dst32[width - 1] = src32[0];
  }
}